

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_with(REF_EDGE ref_edge,REF_INT node0,REF_INT node1,REF_INT *edge)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_ADJ pRVar4;
  long lVar5;
  REF_ADJ_ITEM pRVar6;
  
  *edge = -1;
  if (((-1 < node0) && (pRVar4 = ref_edge->adj, node0 < pRVar4->nnode)) &&
     (lVar5 = (long)pRVar4->first[(uint)node0], lVar5 != -1)) {
    pRVar6 = pRVar4->item;
    do {
      iVar1 = pRVar6[lVar5].ref;
      iVar2 = ref_edge->e2n[(long)iVar1 * 2];
      iVar3 = ref_edge->e2n[iVar1 * 2 + 1];
      if (((iVar2 == node0) && (iVar3 == node1)) || ((iVar2 == node1 && (iVar3 == node0)))) {
        *edge = iVar1;
        return 0;
      }
      pRVar6 = ref_edge->adj->item;
      lVar5 = (long)pRVar6[(int)lVar5].next;
    } while (lVar5 != -1);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_edge_with(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1, REF_INT *edge) {
  REF_INT item, ref;
  REF_INT n0, n1;

  *edge = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_edge_adj(ref_edge), node0, item, ref) {
    n0 = ref_edge_e2n(ref_edge, 0, ref);
    n1 = ref_edge_e2n(ref_edge, 1, ref);
    if ((n0 == node0 && n1 == node1) || (n0 == node1 && n1 == node0)) {
      *edge = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}